

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O2

int Tim_ManBoxInputLast(Tim_Man_t *p,int iBox)

{
  int iVar1;
  int iVar2;
  Tim_Box_t *pTVar3;
  
  pTVar3 = Tim_ManBox(p,iBox);
  iVar1 = pTVar3[1].iBox;
  iVar2 = Tim_ManBoxInputNum(p,iBox);
  return iVar2 + iVar1 + -1;
}

Assistant:

int Tim_ManBoxInputLast( Tim_Man_t * p, int iBox )
{
    return Tim_ManBox(p, iBox)->Inouts[0] + Tim_ManBoxInputNum(p, iBox) - 1;
}